

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

bool despot::util::tinyxml::TiXmlBase::StringEqual
               (char *p,char *tag,bool ignoreCase,TiXmlEncoding encoding)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1ef,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (tag == (char *)0x0) {
    __assert_fail("tag",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f0,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (*p == '\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f2,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  cVar2 = *p;
  if (ignoreCase) {
    if (cVar2 != '\0') {
      pcVar5 = p + 1;
      do {
        cVar1 = *tag;
        if (cVar1 == '\0') break;
        iVar3 = tolower((int)cVar2);
        iVar4 = tolower((int)cVar1);
        if (iVar3 != iVar4) break;
        tag = tag + 1;
        cVar2 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar2 != '\0');
    }
  }
  else if (cVar2 != '\0') {
    pcVar5 = p + 1;
    do {
      if (cVar2 != *tag) break;
      tag = tag + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  return *tag == '\0';
}

Assistant:

bool TiXmlBase::StringEqual(const char* p, const char* tag, bool ignoreCase,
	TiXmlEncoding encoding) {
	assert(p);
	assert(tag);
	if (!p || !*p) {
		assert(0);
		return false;
	}

	const char* q = p;

	if (ignoreCase) {
		while (*q && *tag && ToLower(*q, encoding) == ToLower(*tag, encoding)) {
			++q;
			++tag;
		}

		if (*tag == 0)
			return true;
	} else {
		while (*q && *tag && *q == *tag) {
			++q;
			++tag;
		}

		if (*tag == 0) // Have we found the end of the tag, and everything equal?
			return true;
	}
	return false;
}